

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall fmp4_stream::trun::size(trun *this)

{
  uint64_t uVar1;
  uint64_t local_18;
  uint64_t l_size;
  trun *this_local;
  
  uVar1 = full_box::size(&this->super_full_box);
  local_18 = uVar1 + 4;
  if ((this->data_offset_present_ & 1U) != 0) {
    local_18 = uVar1 + 8;
  }
  if ((this->first_sample_flags_present_ & 1U) != 0) {
    local_18 = local_18 + 4;
  }
  if ((this->sample_duration_present_ & 1U) != 0) {
    local_18 = (uint)(*(int *)&(this->super_full_box).field_0x6c << 2) + local_18;
  }
  if ((this->sample_size_present_ & 1U) != 0) {
    local_18 = (uint)(*(int *)&(this->super_full_box).field_0x6c << 2) + local_18;
  }
  if ((this->sample_flags_present_ & 1U) != 0) {
    local_18 = (uint)(*(int *)&(this->super_full_box).field_0x6c << 2) + local_18;
  }
  if ((this->sample_composition_time_offsets_present_ & 1U) != 0) {
    local_18 = (uint)(*(int *)&(this->super_full_box).field_0x6c << 2) + local_18;
  }
  return local_18;
}

Assistant:

uint64_t trun::size() const
	{
		uint64_t l_size = full_box::size() + 4;
		if (data_offset_present_)
			l_size += 4;
		if (first_sample_flags_present_)
			l_size += 4;
		if (sample_duration_present_)
			l_size += (sample_count_ * 4);
		if (sample_size_present_)
			l_size += (sample_count_ * 4);
		if (sample_flags_present_)
			l_size += (sample_count_ * 4);
		if (this->sample_composition_time_offsets_present_)
			l_size += (sample_count_ * 4);
		return l_size;
	}